

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void thumb_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  TCGContext_conflict1 *pTVar1;
  target_ulong tVar2;
  _Bool _Var3;
  DisasJumpType DVar4;
  DisasJumpType DVar5;
  int iVar6;
  undefined1 *puVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  uint32_t target_el;
  void *uc;
  DisasJumpType DVar11;
  uint uVar12;
  abi_ptr aVar13;
  bool bVar14;
  target_ulong local_68 [4];
  TCGContext_conflict1 *local_48;
  CPUArchState_conflict1 *local_40;
  void *local_38;
  
  uc = (void *)dcbase[8].pc_next;
  pTVar1 = *(TCGContext_conflict1 **)((long)uc + 0x2e8);
  local_40 = (CPUArchState_conflict1 *)cpu->env_ptr;
  _Var3 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (_Var3) {
    return;
  }
  local_68[0] = dcbase->pc_next;
  if (*(int *)((long)uc + 0x57c) == 0) {
    bVar14 = *(target_ulong *)((long)uc + (long)*(int *)((long)uc + 0x39e0) * 8 + 0x578) ==
             local_68[0];
  }
  else {
    puVar7 = (undefined1 *)g_tree_lookup(*(GTree **)((long)uc + 0x780),local_68);
    bVar14 = puVar7 == &DAT_00000001;
  }
  if (bVar14) {
    dcbase->is_jmp = DISAS_TARGET_2;
    return;
  }
  aVar13 = dcbase->pc_next;
  dcbase[1].pc_first = aVar13;
  iVar6 = *(int *)((long)&dcbase[2].pc_first + 4);
  local_48 = pTVar1;
  DVar4 = cpu_lduw_code_aarch64(local_40,aVar13);
  DVar11 = (uint)(ushort)((ushort)DVar4 << 8 | (ushort)DVar4 >> 8);
  if (iVar6 == 0) {
    DVar11 = DVar4;
  }
  DVar11 = DVar11 & 0xffff;
  tVar2 = dcbase->pc_next;
  _Var3 = thumb_insn_is_16bit((DisasContext_conflict1 *)dcbase,(uint32_t)tVar2,DVar11);
  aVar13 = tVar2 + 2;
  dcbase->pc_next = aVar13;
  if (!_Var3) {
    iVar6 = *(int *)((long)&dcbase[2].pc_first + 4);
    local_38 = uc;
    DVar5 = cpu_lduw_code_aarch64(local_40,aVar13);
    DVar4 = (uint)(ushort)((ushort)DVar5 << 8 | (ushort)DVar5 >> 8);
    if (iVar6 == 0) {
      DVar4 = DVar5;
    }
    DVar11 = DVar11 << 0x10 | DVar4 & 0xffff;
    dcbase->pc_next = dcbase->pc_next + 2;
    uc = local_38;
  }
  dcbase[1].is_jmp = DVar11;
  if ((((*(int *)&dcbase[2].tb != 0) && ((DVar11 & 0xffffff00) != 0xbe00)) &&
      (((DVar11 & 0xffffffc0) != 0xba80 || ((dcbase[4].pc_first & 0x8000200) != 0x8000000)))) &&
     (((DVar11 != 0xe97fe97f || ((~(uint)dcbase[4].pc_first & 0x8000200) != 0)) &&
      (uVar12 = *(uint *)((long)&dcbase[2].tb + 4), uVar12 < 0xe)))) {
    arm_skip_unless((DisasContext_conflict1 *)dcbase,uVar12);
  }
  *(bool *)((long)uc + 0x7da) = *(int *)&dcbase[2].tb != 0;
  uVar12 = (uint)!_Var3 * 2 + 2;
  uVar8 = dcbase->pc_next - (ulong)uVar12;
  for (puVar10 = *(undefined8 **)((long)uc + 0x358); puVar10 != (undefined8 *)0x0;
      puVar10 = (undefined8 *)*puVar10) {
    lVar9 = puVar10[1];
    if ((((*(ulong *)(lVar9 + 0x18) <= uVar8) && (uVar8 <= *(ulong *)(lVar9 + 0x20))) ||
        (*(ulong *)(lVar9 + 0x20) < *(ulong *)(lVar9 + 0x18))) &&
       (*(char *)(lVar9 + 0x14) != '\x01')) break;
  }
  if (puVar10 != (undefined8 *)0x0) {
    pTVar1 = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
    tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_R[0xf] + (long)pTVar1),
                        (long)(int)uVar8);
    pTVar1 = local_48;
    gen_uc_tracecode(local_48,uVar12,(uint)*(byte *)((long)uc + 0x7da) << 6 | 2,uc,
                     dcbase->pc_next - (ulong)uVar12);
    check_exit_request_aarch64(pTVar1);
  }
  if (_Var3) {
    (*(code *)(&DAT_00d805c4 + *(int *)(&DAT_00d805c4 + (ulong)((DVar11 & 0xffff) >> 0xc) * 4)))();
    return;
  }
  if (((uint)dcbase[4].pc_first & 0x220) == 0x200) {
    lVar9 = 0;
    do {
      if ((*(DisasJumpType *)((long)&disas_thumb2_insn_armv6m_mask + lVar9) & DVar11) ==
          *(DisasJumpType *)((long)&disas_thumb2_insn_armv6m_insn + lVar9)) goto LAB_00665a5a;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x18);
  }
  else if ((DVar11 & 0xf800e800) == 0xf000e800 || (dcbase[4].pc_first & 0x40) != 0) {
LAB_00665a5a:
    _Var3 = disas_t32((DisasContext_conflict1 *)dcbase,DVar11);
    if (((_Var3) || (_Var3 = disas_vfp_uncond((DisasContext_conflict1 *)dcbase,DVar11), _Var3)) ||
       (((DVar11 & 0xf0000000) == 0xe0000000 &&
        (_Var3 = disas_vfp((DisasContext_conflict1 *)dcbase,DVar11), _Var3)))) goto LAB_006669ab;
    uVar12 = DVar11 >> 0x19 & 0xf;
    if (uVar12 < 0x10) {
      if ((0xc0c0U >> uVar12 & 1) == 0) {
        if (uVar12 == 0xc) {
          if ((DVar11 & 0x1100000) == 0x1000000) {
            iVar6 = disas_neon_ls_insn((DisasContext_conflict1 *)dcbase,DVar11);
            goto LAB_00666489;
          }
        }
        else if ((0xfU >> uVar12 & 1) != 0) {
          abort();
        }
      }
      else {
        uVar12 = (uint)dcbase[4].pc_first;
        if ((uVar12 >> 9 & 1) == 0) {
          if ((uVar12 >> 0x1b & 1) == 0 || (DVar11 & 0xfe000a00) != 0xfc000800) {
            if ((DVar11 & 0xff000a00) == 0xfe000800 && (uVar12 >> 0x1b & 1) != 0) {
              iVar6 = disas_neon_insn_2reg_scalar_ext((DisasContext_conflict1 *)dcbase,DVar11);
            }
            else if ((~DVar11 & 0x3000000) == 0) {
              iVar6 = disas_neon_data_insn
                                ((DisasContext_conflict1 *)dcbase,
                                 (DVar11 & 0xe2ffffff) + (DVar11 >> 4 & 0x1000000) + 0x10000000);
            }
            else {
              if (((byte)(DVar11 >> 0x1c) & 1) != 0 || (DVar11 & 0xe00) == 0xa00) goto LAB_00665a4d;
              iVar6 = disas_coproc_insn((DisasContext_conflict1 *)dcbase,DVar11);
            }
          }
          else {
            iVar6 = disas_neon_insn_3same_ext((DisasContext_conflict1 *)dcbase,DVar11);
          }
LAB_00666489:
          if (iVar6 == 0) goto LAB_006669ab;
        }
        else if (((~DVar11 & 0x3000000) != 0) &&
                (((DVar11 & 0xe00) != 0xa00 || (((ulong)(dcbase[1].tb)->orig_tb & 0xf0) == 0)))) {
          if ((dcbase[2].is_jmp != 0x17) ||
             (target_el = 3, *(char *)((long)&dcbase[3].tb + 4) == '\0')) {
            target_el = 1;
            if (1 < dcbase[3].max_insns) {
              target_el = dcbase[3].max_insns;
            }
          }
          gen_exception_insn((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase[1].pc_first,0x11,
                             0x2000000,target_el);
          goto LAB_006669ab;
        }
      }
    }
  }
LAB_00665a4d:
  unallocated_encoding_aarch64((DisasContext_conflict1 *)dcbase);
LAB_006669ab:
  uVar12 = *(uint *)&dcbase[2].tb;
  if (uVar12 != 0) {
    *(uint *)((long)&dcbase[2].tb + 4) = uVar12 >> 4 & 1 | *(uint *)((long)&dcbase[2].tb + 4) & 0xe;
    uVar12 = uVar12 * 2 & 0x1e;
    *(uint *)&dcbase[2].tb = uVar12;
    if (uVar12 == 0) {
      *(undefined4 *)((long)&dcbase[2].tb + 4) = 0;
    }
  }
  arm_post_translate_insn((DisasContext_conflict1 *)dcbase);
  if (dcbase->is_jmp == DISAS_NEXT) {
    uVar8 = dcbase->pc_next - dcbase[1].pc_next;
    iVar6 = (int)*(undefined8 *)(*(long *)((long)uc + 0x290) + 8);
    if (((ulong)(long)-iVar6 <= uVar8) ||
       (((ulong)(long)(-3 - iVar6) <= uVar8 &&
        (_Var3 = insn_crosses_page(local_40,(DisasContext_conflict1 *)dcbase), _Var3)))) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  return;
}

Assistant:

static void thumb_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUARMState *env = cpu->env_ptr;
    uint32_t insn;
    bool is_16bit;
    uint32_t insn_size;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
        return;
    }

    dc->pc_curr = dc->base.pc_next;
    insn = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);
    is_16bit = thumb_insn_is_16bit(dc, dc->base.pc_next, insn);
    dc->base.pc_next += 2;
    if (!is_16bit) {
        uint32_t insn2 = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);

        insn = insn << 16 | insn2;
        dc->base.pc_next += 2;
    }
    dc->insn = insn;

    if (dc->condexec_mask && !thumb_insn_is_unconditional(dc, insn)) {
        uint32_t cond = dc->condexec_cond;

        /*
         * Conditionally skip the insn. Note that both 0xe and 0xf mean
         * "always"; 0xf is not "never".
         */
        if (cond < 0x0e) {
            arm_skip_unless(dc, cond);
        }
    }
    
    // Unicorn:
    //   We can't stop in the middle of the IT block.
    //   In other words, treat the whole IT block as
    //   a single instruction.
    uc->no_exit_request = (dc->condexec_mask != 0);

    // Unicorn: trace this instruction on request
    insn_size = is_16bit ? 2 : 4;
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->base.pc_next - insn_size)) {
        
        // Sync PC in advance
        gen_set_pc_im(dc, dc->base.pc_next - insn_size);

        if (uc->no_exit_request) {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX | UC_HOOK_FLAG_NO_STOP, uc, dc->base.pc_next - insn_size);
        } else {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, uc, dc->base.pc_next - insn_size);
        }
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    if (is_16bit) {
        disas_thumb_insn(dc, insn);
    } else {
        disas_thumb2_insn(dc, insn);
    }

    /* Advance the Thumb condexec condition.  */
    if (dc->condexec_mask) {
        dc->condexec_cond = ((dc->condexec_cond & 0xe) |
                             ((dc->condexec_mask >> 4) & 1));
        dc->condexec_mask = (dc->condexec_mask << 1) & 0x1f;
        if (dc->condexec_mask == 0) {
            dc->condexec_cond = 0;
        }
    }

    arm_post_translate_insn(dc);

    /* Thumb is a variable-length ISA.  Stop translation when the next insn
     * will touch a new page.  This ensures that prefetch aborts occur at
     * the right place.
     *
     * We want to stop the TB if the next insn starts in a new page,
     * or if it spans between this page and the next. This means that
     * if we're looking at the last halfword in the page we need to
     * see if it's a 16-bit Thumb insn (which will fit in this TB)
     * or a 32-bit Thumb insn (which won't).
     * This is to avoid generating a silly TB with a single 16-bit insn
     * in it at the end of this page (which would execute correctly
     * but isn't very efficient).
     */
    if (dc->base.is_jmp == DISAS_NEXT
        && (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE
            || (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE - 3
                && insn_crosses_page(env, dc)))) {
        dc->base.is_jmp = DISAS_TOO_MANY;
    }
}